

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFilesGenerator::GenerateScriptForConfig
          (cmInstallFilesGenerator *this,ostream *os,string *config,Indent *indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Snapshot snapshot;
  char *pcVar3;
  pointer pbVar4;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmGeneratorExpression ge;
  allocator local_149;
  auto_ptr<cmCompiledGeneratorExpression> local_148;
  cmCommandContext local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  ostream *local_f8;
  Indent *local_f0;
  string local_e8;
  undefined1 local_c8 [64];
  Snapshot local_88;
  cmGeneratorExpression local_70;
  
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = os;
  local_f0 = indent;
  cmState::Snapshot::Snapshot(&local_88,(cmState *)0x0);
  paVar1 = &local_140.Name.field_2;
  local_140.Name._M_string_length = 0;
  local_140.Name.field_2._M_local_buf[0] = '\0';
  local_140.Line = 0;
  snapshot.Position.Tree = local_88.Position.Tree;
  snapshot.State = local_88.State;
  snapshot.Position.Position = local_88.Position.Position;
  local_140.Name._M_dataplus._M_p = (pointer)paVar1;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_c8,snapshot,&local_140);
  cmGeneratorExpression::cmGeneratorExpression(&local_70,(cmListFileBacktrace *)local_c8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_140.Name._M_dataplus._M_p,
                    CONCAT71(local_140.Name.field_2._M_allocated_capacity._1_7_,
                             local_140.Name.field_2._M_local_buf[0]) + 1);
  }
  pbVar4 = (this->Files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (this->Files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(string *)&local_70);
      local_148.x_ = (cmCompiledGeneratorExpression *)local_c8._0_8_;
      local_c8._0_8_ = (cmCompiledGeneratorExpression *)0x0;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_c8);
      local_140.Name._M_string_length = 0;
      local_140.Name.field_2._M_local_buf[0] = '\0';
      local_140.Name._M_dataplus._M_p = (pointer)paVar1;
      pcVar3 = cmCompiledGeneratorExpression::Evaluate
                         (local_148.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                          &local_140.Name);
      std::__cxx11::string::string((string *)local_c8,pcVar3,&local_149);
      cmSystemTools::ExpandListArgument((string *)local_c8,&local_118,false);
      if ((cmCompiledGeneratorExpression *)local_c8._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_140.Name._M_dataplus._M_p,
                        CONCAT71(local_140.Name.field_2._M_allocated_capacity._1_7_,
                                 local_140.Name.field_2._M_local_buf[0]) + 1);
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_148);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (this->Files).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar2 = (config->_M_dataplus)._M_p;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar2,pcVar2 + config->_M_string_length);
  AddFilesInstallRule(this,local_f8,&local_e8,local_f0,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  return;
}

Assistant:

void cmInstallFilesGenerator::GenerateScriptForConfig(std::ostream& os,
                                                    const std::string& config,
                                                    Indent const& indent)
{
  std::vector<std::string> files;
  cmGeneratorExpression ge;
  for(std::vector<std::string>::const_iterator i = this->Files.begin();
      i != this->Files.end(); ++i)
    {
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
    cmSystemTools::ExpandListArgument(cge->Evaluate(
        this->LocalGenerator, config), files);
    }
  this->AddFilesInstallRule(os, config, indent, files);
}